

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

void INT_EVassoc_conversion_action
               (CManager_conflict cm,int stone_id,int stage,FMFormat target_format,
               FMFormat incoming_format)

{
  response_cache_element *prVar1;
  FMFormat *pp_Var2;
  uint uVar3;
  int iVar4;
  stone_type p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  response_cache_element *prVar9;
  FFSContext p_Var10;
  FFSTypeHandle p_Var11;
  long lVar12;
  int id_len;
  undefined1 local_34 [4];
  
  p_Var5 = stone_struct(cm->evp,stone_id);
  if (p_Var5 != (stone_type)0x0) {
    uVar3 = p_Var5->response_cache_count;
    lVar12 = (long)(int)uVar3;
    uVar6 = get_server_ID_FMformat(incoming_format,local_34);
    iVar4 = CMtrace_val[10];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVerbose);
    }
    if (iVar4 != 0) {
      uVar7 = global_name_of_FMFormat(target_format);
      uVar8 = global_name_of_FMFormat(incoming_format);
      fprintf((FILE *)cm->CMTrace_file,"Adding Conversion action %d to ",(ulong)uVar3);
      fprint_stone_identifier(cm->CMTrace_file,cm->evp,stone_id);
      fprintf((FILE *)cm->CMTrace_file,"\n   Incoming format is %s, target %s\n",uVar8,uVar7);
    }
    prVar9 = (response_cache_element *)INT_CMrealloc(p_Var5->response_cache,lVar12 * 0x30 + 0x30);
    p_Var5->response_cache = prVar9;
    prVar1 = prVar9 + lVar12;
    prVar1->reference_format = (FMFormat)0x0;
    prVar1->stage = Immediate;
    prVar1->action_type = Action_NoAction;
    pp_Var2 = &prVar9[lVar12].o.decode.target_reference_format;
    *pp_Var2 = (FMFormat)0x0;
    pp_Var2[1] = (FMFormat)0x0;
    prVar1 = prVar9 + lVar12;
    prVar1->proto_action_id = 0;
    prVar1->requires_decoded = 0;
    (((anon_union_24_3_3bd03a9c_for_o *)(&prVar1->proto_action_id + 2))->decode).decode_format =
         (FFSTypeHandle)0x0;
    prVar9[lVar12].reference_format = incoming_format;
    prVar9[lVar12].stage = Immediate;
    prVar9[lVar12].action_type = Action_Decode;
    p_Var10 = (FFSContext)create_FFSContext_FM(cm->evp->fmc);
    prVar9[lVar12].o.decode.context = p_Var10;
    p_Var11 = (FFSTypeHandle)FFSTypeHandle_from_encode(p_Var10,uVar6);
    prVar9[lVar12].o.decode.decode_format = p_Var11;
    prVar9[lVar12].o.decode.target_reference_format = target_format;
    p_Var10 = prVar9[lVar12].o.decode.context;
    uVar6 = format_list_of_FMFormat(target_format);
    establish_conversion(p_Var10,p_Var11,uVar6);
    p_Var5->response_cache_count = p_Var5->response_cache_count + 1;
  }
  return;
}

Assistant:

extern void
INT_EVassoc_conversion_action(CManager cm, int stone_id, int stage, 
			      FMFormat target_format, FMFormat incoming_format)
{
    response_cache_element *act;
    stone_type stone;
    int a;
    int id_len;
    FFSTypeHandle format;
    char *server_id;

    stone = stone_struct(cm->evp, stone_id);
    if (!stone) return;

    a = stone->response_cache_count;
    server_id = get_server_ID_FMformat(incoming_format, &id_len);

    if (CMtrace_on(cm, EVerbose)) {
	char *target_tmp = global_name_of_FMFormat(target_format);
	char *incoming_tmp = global_name_of_FMFormat(incoming_format);
	fprintf(cm->CMTrace_file, "Adding Conversion action %d to ", a);
	fprint_stone_identifier(cm->CMTrace_file, cm->evp, stone_id);
	fprintf(cm->CMTrace_file, "\n   Incoming format is %s, target %s\n", incoming_tmp, 
	       target_tmp);
    }
    stone->response_cache = realloc(stone->response_cache,
			     sizeof(stone->response_cache[0]) * (a + 1));
    act = & stone->response_cache[a];
    memset(act, 0, sizeof(*act));
    act->requires_decoded = 0;
    act->action_type = Action_Decode;
    act->reference_format = incoming_format;
    act->stage = Immediate;

    act->o.decode.context = create_FFSContext_FM(cm->evp->fmc);
    format = FFSTypeHandle_from_encode(act->o.decode.context, 
				      server_id);
    act->o.decode.decode_format = format;
    act->o.decode.target_reference_format = target_format;
    establish_conversion(act->o.decode.context, format,
			 format_list_of_FMFormat(act->o.decode.target_reference_format));
    stone->response_cache_count++;
}